

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roster.cpp
# Opt level: O1

void __thiscall Roster::printInvalidEmails(Roster *this)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  string currentEmail;
  string local_50;
  
  lVar3 = 0;
  do {
    Student::getEmail_abi_cxx11_(&local_50,this->classRosterArray[lVar3]);
    lVar1 = std::__cxx11::string::find((char *)&local_50,0x106119,0);
    if (lVar1 == -1) {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2," ---> Missing \'@\' character in email",0x24);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    lVar1 = std::__cxx11::string::find((char *)&local_50,0x106100,0);
    if (lVar1 == -1) {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2," ---> Missing \'.\' character in email",0x24);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    lVar1 = std::__cxx11::string::find((char *)&local_50,0x10603b,0);
    if (lVar1 != -1) {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"---> White space not allowed in email",0x25);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

void Roster::printInvalidEmails() {
    for (int i = 0; i < ARRAY_LENGTH; i++) {
        string currentEmail = classRosterArray[i]->getEmail();

        size_t foundAtSymbol = currentEmail.find("@");
        if (foundAtSymbol == string::npos) {
            cout << currentEmail << " ---> Missing '@' character in email" << endl;
        }

        size_t foundPeriod = currentEmail.find(".");
        if (foundPeriod == string::npos) {
            cout << currentEmail << " ---> Missing '.' character in email" << endl;
        }

        size_t foundWhiteSpace = currentEmail.find(" ");
        if (foundWhiteSpace != string::npos) {
            cout << currentEmail << "---> White space not allowed in email" << endl;
        }
    }
}